

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O3

int Abc_CommandAbs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Wlc_Ntk_t *p;
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  Wlc_Par_t Pars;
  Wlc_Par_t local_98;
  
  p = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  Wlc_ManSetDefaultParams(&local_98);
  Extra_UtilGetoptReset();
LAB_003566dd:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"AMXFILdxvwh");
    iVar1 = globalUtilOptind;
    if (iVar2 < 0x58) {
      switch(iVar2) {
      case 0x46:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_0035686f:
          Abc_Print(-1,pcVar4);
          goto switchD_003566fe_caseD_47;
        }
        uVar3 = atoi(argv[globalUtilOptind]);
        local_98.nBitsFlop = uVar3;
        break;
      case 0x47:
      case 0x48:
      case 0x4a:
      case 0x4b:
        goto switchD_003566fe_caseD_47;
      case 0x49:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-I\" should be followed by an integer.\n";
          goto LAB_0035686f;
        }
        uVar3 = atoi(argv[globalUtilOptind]);
        local_98.nIterMax = uVar3;
        break;
      case 0x4c:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
          goto LAB_0035686f;
        }
        uVar3 = atoi(argv[globalUtilOptind]);
        local_98.nLimit = uVar3;
        break;
      case 0x4d:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-M\" should be followed by an integer.\n";
          goto LAB_0035686f;
        }
        uVar3 = atoi(argv[globalUtilOptind]);
        local_98.nBitsMul = uVar3;
        break;
      default:
        if (iVar2 != 0x41) {
          if (iVar2 == -1) {
            if (p != (Wlc_Ntk_t *)0x0) {
              Wlc_NtkAbsCore(p,&local_98);
              return 0;
            }
            Abc_Print(1,"Abc_CommandCone(): There is no current design.\n");
            return 0;
          }
          goto switchD_003566fe_caseD_47;
        }
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-A\" should be followed by an integer.\n";
          goto LAB_0035686f;
        }
        uVar3 = atoi(argv[globalUtilOptind]);
        local_98.nBitsAdd = uVar3;
      }
    }
    else {
      if (0x75 < iVar2) {
        if (iVar2 == 0x76) {
          local_98.fVerbose = local_98.fVerbose ^ 1;
        }
        else if (iVar2 == 0x77) {
          local_98.fPdrVerbose = local_98.fPdrVerbose ^ 1;
        }
        else {
          if (iVar2 != 0x78) goto switchD_003566fe_caseD_47;
          local_98.fXorOutput = local_98.fXorOutput ^ 1;
        }
        goto LAB_003566dd;
      }
      if (iVar2 != 0x58) {
        if (iVar2 != 100) goto switchD_003566fe_caseD_47;
        local_98.fAbs2 = local_98.fAbs2 ^ 1;
        goto LAB_003566dd;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-X\" should be followed by an integer.\n";
        goto LAB_0035686f;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_98.nBitsMux = uVar3;
    }
    globalUtilOptind = iVar1 + 1;
    if ((int)uVar3 < 0) {
switchD_003566fe_caseD_47:
      Abc_Print(-2,"usage: %%abs [-AMXFIL num] [-dxvwh]\n");
      Abc_Print(-2,"\t         abstraction for word-level networks\n");
      Abc_Print(-2,
                "\t-A num : minimum bit-width of an adder/subtractor to abstract [default = %d]\n",
                (ulong)(uint)local_98.nBitsAdd);
      Abc_Print(-2,"\t-M num : minimum bit-width of a multiplier to abstract [default = %d]\n",
                (ulong)(uint)local_98.nBitsMul);
      Abc_Print(-2,"\t-X num : minimum bit-width of a MUX operator to abstract [default = %d]\n",
                (ulong)(uint)local_98.nBitsMux);
      Abc_Print(-2,"\t-F num : minimum bit-width of a flip-flop to abstract [default = %d]\n",
                (ulong)(uint)local_98.nBitsFlop);
      Abc_Print(-2,"\t-I num : maximum number of CEGAR iterations [default = %d]\n",
                (ulong)(uint)local_98.nIterMax);
      Abc_Print(-2,"\t-L num : maximum number of each type of signals [default = %d]\n",
                (ulong)(uint)local_98.nLimit);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_98.fAbs2 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using another way of creating abstractions [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (local_98.fXorOutput == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-x     : toggle XORing outputs of word-level miter [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_98.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      if (local_98.fPdrVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing verbose PDR output [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    Wlc_Par_t Pars, * pPars = &Pars;
    int c;
    Wlc_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "AMXFILdxvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsAdd < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsMul = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsMul < 0 )
                goto usage;
            break;
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsMux = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsMux < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsFlop = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsFlop < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLimit < 0 )
                goto usage;
            break;
        case 'd':
            pPars->fAbs2 ^= 1;
            break;
        case 'x':
            pPars->fXorOutput ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fPdrVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandCone(): There is no current design.\n" );
        return 0;
    }
    Wlc_NtkAbsCore( pNtk, pPars );
    return 0;
usage:
    Abc_Print( -2, "usage: %%abs [-AMXFIL num] [-dxvwh]\n" );
    Abc_Print( -2, "\t         abstraction for word-level networks\n" );
    Abc_Print( -2, "\t-A num : minimum bit-width of an adder/subtractor to abstract [default = %d]\n", pPars->nBitsAdd );
    Abc_Print( -2, "\t-M num : minimum bit-width of a multiplier to abstract [default = %d]\n",        pPars->nBitsMul );
    Abc_Print( -2, "\t-X num : minimum bit-width of a MUX operator to abstract [default = %d]\n",      pPars->nBitsMux );
    Abc_Print( -2, "\t-F num : minimum bit-width of a flip-flop to abstract [default = %d]\n",         pPars->nBitsFlop );
    Abc_Print( -2, "\t-I num : maximum number of CEGAR iterations [default = %d]\n",                   pPars->nIterMax );
    Abc_Print( -2, "\t-L num : maximum number of each type of signals [default = %d]\n",               pPars->nLimit );
    Abc_Print( -2, "\t-d     : toggle using another way of creating abstractions [default = %s]\n",    pPars->fAbs2? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle XORing outputs of word-level miter [default = %s]\n",            pPars->fXorOutput? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                  pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing verbose PDR output [default = %s]\n",                   pPars->fPdrVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}